

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

nvpair_t * nvpair_create_descriptor_array(char *name,int *value,size_t nitems)

{
  int iVar1;
  int *piVar2;
  void *__ptr;
  int _serrno;
  int *fds;
  nvpair_t *nvp;
  uint ii;
  size_t nitems_local;
  int *value_local;
  char *name_local;
  
  if (value == (int *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    name_local = (char *)0x0;
  }
  else {
    fds = (int *)0x0;
    __ptr = malloc(nitems << 2);
    if (__ptr == (void *)0x0) {
      name_local = (char *)0x0;
    }
    else {
      for (nvp._4_4_ = 0; nvp._4_4_ < nitems; nvp._4_4_ = nvp._4_4_ + 1) {
        if (value[nvp._4_4_] == -1) {
          *(undefined4 *)((long)__ptr + (ulong)nvp._4_4_ * 4) = 0xffffffff;
        }
        else {
          iVar1 = fcntl(value[nvp._4_4_],0x406,0);
          *(int *)((long)__ptr + (ulong)nvp._4_4_ * 4) = iVar1;
          if (*(int *)((long)__ptr + (ulong)nvp._4_4_ * 4) == -1) goto LAB_0010ec33;
        }
      }
      fds = &nvpair_allocv(name,0xc,(uint64_t)__ptr,nitems << 3,nitems)->nvp_magic;
LAB_0010ec33:
      if (fds == (int *)0x0) {
        piVar2 = __errno_location();
        iVar1 = *piVar2;
        for (; nvp._4_4_ != 0; nvp._4_4_ = nvp._4_4_ - 1) {
          if (*(int *)((long)__ptr + (ulong)(nvp._4_4_ - 1) * 4) != -1) {
            close(*(int *)((long)__ptr + (ulong)(nvp._4_4_ - 1) * 4));
          }
        }
        free(__ptr);
        piVar2 = __errno_location();
        *piVar2 = iVar1;
      }
      name_local = (char *)fds;
    }
  }
  return (nvpair_t *)name_local;
}

Assistant:

nvpair_t *
nvpair_create_descriptor_array(const char *name, const int *value,
    size_t nitems)
{
	unsigned int ii;
	nvpair_t *nvp;
	int *fds;

	if (value == NULL) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp = NULL;

	fds = nv_malloc(sizeof(value[0]) * nitems);
	if (fds == NULL)
		return (NULL);
	for (ii = 0; ii < nitems; ii++) {
		if (value[ii] == -1) {
			fds[ii] = -1;
		} else {
			fds[ii] = fcntl(value[ii], F_DUPFD_CLOEXEC, 0);
			if (fds[ii] == -1)
				goto fail;
		}
	}

	nvp = nvpair_allocv(name, NV_TYPE_DESCRIPTOR_ARRAY,
	    (uint64_t)(uintptr_t)fds, sizeof(int64_t) * nitems, nitems);

fail:
	if (nvp == NULL) {
		ERRNO_SAVE();
		for (; ii > 0; ii--) {
			if (fds[ii - 1] != -1)
				close(fds[ii - 1]);
		}
		nv_free(fds);
		ERRNO_RESTORE();
	}

	return (nvp);
}